

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

void __thiscall crnlib::qdxt5::clear(qdxt5 *this)

{
  long in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar1;
  
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  qdxt5_params::clear((qdxt5_params *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0))
  ;
  clusterizer<crnlib::vec<2U,_float>_>::clear
            ((clusterizer<crnlib::vec<2U,_float>_> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  vector<crnlib::vector<unsigned_int>_>::clear
            ((vector<crnlib::vector<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(undefined4 *)(in_RDI + 0x668) = 0;
  *(undefined1 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 100;
  threaded_clusterizer<crnlib::vec<16U,_float>_>::clear
            ((threaded_clusterizer<crnlib::vec<16U,_float>_> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  for (uVar1 = 0; uVar1 < 0x100; uVar1 = uVar1 + 1) {
    vector<crnlib::vector<unsigned_int>_>::clear
              ((vector<crnlib::vector<unsigned_int>_> *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  }
  hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
  ::clear((hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
           *)this);
  *(undefined4 *)(in_RDI + 0x66c) = 0xffffffff;
  return;
}

Assistant:

void qdxt5::clear() {
  m_main_thread_id = 0;
  m_num_blocks = 0;
  m_pBlocks = 0;
  m_pDst_elements = NULL;
  m_elements_per_block = 0;
  m_params.clear();
  m_endpoint_clusterizer.clear();
  m_endpoint_cluster_indices.clear();
  m_max_selector_clusters = 0;
  m_canceled = false;
  m_progress_start = 0;
  m_progress_range = 100;
  m_selector_clusterizer.clear();

  for (uint i = 0; i <= qdxt5_params::cMaxQuality; i++)
    m_cached_selector_cluster_indices[i].clear();

  m_cluster_hash.clear();

  m_prev_percentage_complete = -1;
}